

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O3

void ge_scalarmult_base(ge_p3 *h,uchar *a)

{
  long lVar1;
  char cVar2;
  char cVar4;
  uint uVar5;
  int iVar6;
  timeval *in_R8;
  ulong uVar7;
  undefined1 auVar8 [16];
  char e [64];
  ge_precomp t;
  ge_p2 s;
  ge_p1p1 r;
  char local_1f8 [63];
  char local_1b9;
  ge_precomp local_1b8;
  ge_p2 local_140;
  ge_p1p1 local_c8;
  byte bVar3;
  fd_set *__exceptfds;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  lVar1 = 0;
  do {
    uVar7 = *(ulong *)(a + lVar1);
    bVar3 = (byte)(uVar7 >> 0x38);
    auVar16._8_6_ = 0;
    auVar16._0_8_ = uVar7;
    auVar16[0xe] = bVar3;
    auVar16[0xf] = bVar3 >> 4;
    auVar15._14_2_ = auVar16._14_2_;
    auVar15._8_5_ = 0;
    auVar15._0_8_ = uVar7;
    auVar15[0xd] = (char)(ushort)(uVar7 >> 0x34);
    auVar14._13_3_ = auVar15._13_3_;
    auVar14._8_4_ = 0;
    auVar14._0_8_ = uVar7;
    auVar14[0xc] = (char)(uVar7 >> 0x30);
    auVar13._12_4_ = auVar14._12_4_;
    auVar13._8_3_ = 0;
    auVar13._0_8_ = uVar7;
    bVar3 = (byte)(uVar7 >> 0x28);
    auVar13[0xb] = bVar3 >> 4;
    auVar12._11_5_ = auVar13._11_5_;
    auVar12._8_2_ = 0;
    auVar12._0_8_ = uVar7;
    auVar12[10] = bVar3;
    auVar11._10_6_ = auVar12._10_6_;
    auVar11[8] = 0;
    auVar11._0_8_ = uVar7;
    auVar11[9] = (char)((ushort)(uVar7 >> 0x20) >> 4);
    auVar10._9_7_ = auVar11._9_7_;
    auVar10[8] = (char)(uVar7 >> 0x20);
    auVar10._0_8_ = uVar7;
    auVar9._8_8_ = auVar10._8_8_;
    bVar3 = (byte)(uVar7 >> 0x18);
    auVar9[7] = bVar3 >> 4;
    auVar9[6] = bVar3;
    auVar9[5] = (char)((ushort)(uVar7 >> 0x10) >> 4);
    auVar9[4] = (char)(uVar7 >> 0x10);
    bVar3 = (byte)(uVar7 >> 8);
    auVar9[3] = bVar3 >> 4;
    auVar9[2] = bVar3;
    auVar9._0_2_ = (ushort)uVar7;
    auVar8._2_14_ = auVar9._2_14_;
    auVar8[0] = (undefined1)uVar7;
    auVar8[1] = (char)((ushort)uVar7 >> 4);
    *(undefined1 (*) [16])(local_1f8 + lVar1 * 2) = auVar8 & _DAT_003f7350;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  lVar1 = 0;
  __exceptfds = (fd_set *)0x0;
  do {
    cVar4 = (char)__exceptfds + local_1f8[lVar1];
    iVar6 = (int)CONCAT71((int7)((ulong)__exceptfds >> 8),cVar4) + 8;
    bVar3 = (byte)iVar6;
    cVar2 = (char)bVar3 >> 4;
    __exceptfds = (fd_set *)(ulong)CONCAT31((int3)((uint)iVar6 >> 8),cVar2);
    local_1f8[lVar1] = cVar4 - (bVar3 & 0xf0);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x3f);
  local_1b9 = local_1b9 + cVar2;
  ge_p3_0(h);
  uVar7 = 0xffffffffffffffff;
  uVar5 = 0;
  do {
    select((int)&local_1b8,(fd_set *)(ulong)uVar5,(fd_set *)(ulong)(uint)(int)local_1f8[uVar7 + 2],
           __exceptfds,in_R8);
    ge_madd(&local_c8,h,&local_1b8);
    ge_p1p1_to_p3(h,&local_c8);
    uVar7 = uVar7 + 2;
    uVar5 = uVar5 + 1;
  } while (uVar7 < 0x3e);
  ge_p3_to_p2(&local_140,h);
  ge_p2_dbl(&local_c8,&local_140);
  ge_p1p1_to_p2(&local_140,&local_c8);
  ge_p2_dbl(&local_c8,&local_140);
  ge_p1p1_to_p2(&local_140,&local_c8);
  ge_p2_dbl(&local_c8,&local_140);
  ge_p1p1_to_p2(&local_140,&local_c8);
  ge_p2_dbl(&local_c8,&local_140);
  ge_p1p1_to_p3(h,&local_c8);
  uVar7 = 0xfffffffffffffffe;
  uVar5 = 0;
  do {
    select((int)&local_1b8,(fd_set *)(ulong)uVar5,(fd_set *)(ulong)(uint)(int)local_1f8[uVar7 + 2],
           __exceptfds,in_R8);
    ge_madd(&local_c8,h,&local_1b8);
    ge_p1p1_to_p3(h,&local_c8);
    uVar7 = uVar7 + 2;
    uVar5 = uVar5 + 1;
  } while (uVar7 < 0x3e);
  return;
}

Assistant:

void ge_scalarmult_base(ge_p3 *h, const unsigned char *a) {
    signed char e[64];
    signed char carry;
    ge_p1p1 r;
    ge_p2 s;
    ge_precomp t;
    int i;

    for (i = 0; i < 32; ++i) {
        e[2 * i + 0] = (a[i] >> 0) & 15;
        e[2 * i + 1] = (a[i] >> 4) & 15;
    }

    /* each e[i] is between 0 and 15 */
    /* e[63] is between 0 and 7 */
    carry = 0;

    for (i = 0; i < 63; ++i) {
        e[i] += carry;
        carry = e[i] + 8;
        carry >>= 4;
        e[i] -= carry << 4;
    }

    e[63] += carry;
    /* each e[i] is between -8 and 8 */
    ge_p3_0(h);

    for (i = 1; i < 64; i += 2) {
        select(&t, i / 2, e[i]);
        ge_madd(&r, h, &t);
        ge_p1p1_to_p3(h, &r);
    }

    ge_p3_dbl(&r, h);
    ge_p1p1_to_p2(&s, &r);
    ge_p2_dbl(&r, &s);
    ge_p1p1_to_p2(&s, &r);
    ge_p2_dbl(&r, &s);
    ge_p1p1_to_p2(&s, &r);
    ge_p2_dbl(&r, &s);
    ge_p1p1_to_p3(h, &r);

    for (i = 0; i < 64; i += 2) {
        select(&t, i / 2, e[i]);
        ge_madd(&r, h, &t);
        ge_p1p1_to_p3(h, &r);
    }
}